

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O0

iterator __thiscall QCborMap::erase(QCborMap *this,iterator it)

{
  long lVar1;
  QCborValueRef QVar2;
  qsizetype in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborMap *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  detach(in_RDI,in_stack_ffffffffffffffc8);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4772f0);
  QCborContainerPrivate::removeAt
            ((QCborContainerPrivate *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x477309);
  QCborContainerPrivate::removeAt
            ((QCborContainerPrivate *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.super_QCborValueConstRef.i = in_RDX;
    QVar2.super_QCborValueConstRef.d = in_RSI;
    return (QCborValueRef)(QCborValueRef)QVar2.super_QCborValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap::iterator QCborMap::erase(QCborMap::iterator it)
{
    detach();

    // remove both key and value
    // ### optimize?
    d->removeAt(it.item.i - 1);
    d->removeAt(it.item.i - 1);
    return it;
}